

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O2

LispPTR DSK_renamefile(LispPTR *args)

{
  uint uVar1;
  bool bVar2;
  FileName *varray;
  char cVar3;
  char *pcVar4;
  int iVar5;
  LispPTR LVar6;
  LispPTR *pLVar7;
  char *dir_00;
  size_t sVar9;
  int *piVar10;
  char *pcVar11;
  long lVar12;
  DLword *pDVar13;
  uint unaff_EBP;
  LispPTR unaff_R14D;
  LispPTR local_504c;
  char ver [16];
  char fbuf [4096];
  char dst [4096];
  char dir [4096];
  char src [4096];
  char vless [4096];
  long lVar8;
  
  iVar5 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar5 != 0) {
    *Lisp_errno = 100;
    return 0;
  }
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[2]);
  pLVar7 = NativeAligned4FromLAddr(*args);
  if (*(char *)((long)pLVar7 + 6) == 'D') {
    local_504c = pLVar7[2] * 2 + 5;
    unaff_EBP = 0;
LAB_0011a116:
    unaff_R14D = local_504c;
    if (0x1000 < (int)local_504c) goto LAB_0011a189;
  }
  else {
    if (*(char *)((long)pLVar7 + 6) == 'C') {
      local_504c = pLVar7[2] + 3;
      unaff_EBP = 1;
      goto LAB_0011a116;
    }
    error("LispStringLength: Not a character array.\n");
  }
  pLVar7 = NativeAligned4FromLAddr(args[1]);
  if (*(char *)((long)pLVar7 + 6) == 'D') {
    unaff_R14D = pLVar7[2] * 2;
    local_504c = unaff_R14D;
LAB_0011a17f:
    iVar5 = unaff_R14D + 5;
  }
  else {
    if (*(char *)((long)pLVar7 + 6) == 'C') {
      unaff_R14D = pLVar7[2];
      local_504c = unaff_R14D;
    }
    else {
      error("LispStringLength: Not a character array.\n");
      if ((unaff_EBP & 1) == 0) goto LAB_0011a17f;
    }
    iVar5 = unaff_R14D + 3;
  }
  if (0x1000 < iVar5) {
LAB_0011a189:
    *Lisp_errno = 200;
    return 0;
  }
  pLVar7 = NativeAligned4FromLAddr(*args);
  LVar6 = 0x1000;
  if ((int)pLVar7[2] < 0x1000) {
    LVar6 = pLVar7[2];
  }
  lVar8 = (long)(int)LVar6;
  if (*(char *)((long)pLVar7 + 6) == 'D') {
    pDVar13 = Lisp_world + (ulong)(ushort)pLVar7[1] + (ulong)(*pLVar7 & 0xfffffff);
    for (lVar12 = 0; lVar8 != lVar12; lVar12 = lVar12 + 1) {
      fbuf[lVar12] = *(char *)((ulong)pDVar13 ^ 2);
      pDVar13 = pDVar13 + 1;
    }
    fbuf[lVar12] = '\0';
  }
  else if (*(char *)((long)pLVar7 + 6) == 'C') {
    uVar1 = *pLVar7;
    LVar6 = pLVar7[1];
    for (lVar12 = 0; lVar8 != lVar12; lVar12 = lVar12 + 1) {
      fbuf[lVar12] = *(char *)((long)Lisp_world +
                               lVar12 + (ulong)(ushort)LVar6 + (ulong)(uVar1 & 0xfffffff) * 2 ^ 3);
    }
    fbuf[lVar8] = '\0';
  }
  else {
    error("LispStringToCString: Not a character array.\n");
  }
  unixpathname(fbuf,src,1,0);
  pLVar7 = NativeAligned4FromLAddr(args[1]);
  LVar6 = 0x1000;
  if ((int)pLVar7[2] < 0x1000) {
    LVar6 = pLVar7[2];
  }
  lVar8 = (long)(int)LVar6;
  if (*(char *)((long)pLVar7 + 6) == 'D') {
    pDVar13 = Lisp_world + (ulong)(ushort)pLVar7[1] + (ulong)(*pLVar7 & 0xfffffff);
    for (lVar12 = 0; lVar8 != lVar12; lVar12 = lVar12 + 1) {
      fbuf[lVar12] = *(char *)((ulong)pDVar13 ^ 2);
      pDVar13 = pDVar13 + 1;
    }
    fbuf[lVar12] = '\0';
  }
  else if (*(char *)((long)pLVar7 + 6) == 'C') {
    uVar1 = *pLVar7;
    LVar6 = pLVar7[1];
    for (lVar12 = 0; lVar8 != lVar12; lVar12 = lVar12 + 1) {
      fbuf[lVar12] = *(char *)((long)Lisp_world +
                               lVar12 + (ulong)(ushort)LVar6 + (ulong)(uVar1 & 0xfffffff) * 2 ^ 3);
    }
    fbuf[lVar8] = '\0';
  }
  else {
    error("LispStringToCString: Not a character array.\n");
  }
  unixpathname(fbuf,dst,1,0);
  iVar5 = unpack_filename(dst,dir,fbuf,ver,1);
  if (iVar5 == 0) {
    return 0;
  }
  dir_00 = dir;
  iVar5 = make_directory(dir_00);
  pcVar11 = dir_00;
  if (iVar5 == 0) {
    return 0;
  }
  for (; (pcVar4 = pcVar11, *pcVar11 == '/' || (pcVar4 = dir_00, *pcVar11 != '\0'));
      pcVar11 = pcVar11 + 1) {
    dir_00 = pcVar4;
  }
  if (pcVar11 + -1 == dir_00) {
    if (dir_00 == dir) {
      dst[0] = '/';
      dst[1] = '\0';
    }
    else {
      strcpy(dst,dir);
    }
  }
  else {
    strcpy(dst,dir);
    sVar9 = strlen(dst);
    (dst + sVar9)[0] = '/';
    (dst + sVar9)[1] = '\0';
  }
  strcat(dst,fbuf);
  iVar5 = maintain_version(dst,0);
  if (iVar5 == 0) {
    return 0;
  }
  iVar5 = get_version_array(dir,fbuf);
  cVar3 = ver[0];
  if (iVar5 == 0) {
    return 0;
  }
  strcpy(dst,fbuf);
  if (cVar3 != '\0') {
    sVar9 = strlen(dst);
    (dst + sVar9)[0] = '.';
    (dst + sVar9)[1] = '~';
    dst[sVar9 + 2] = '\0';
    strcat(dst,ver);
    sVar9 = strlen(dst);
    (dst + sVar9)[0] = '~';
    (dst + sVar9)[1] = '\0';
  }
  iVar5 = get_new(dir,VA.files,dst,fbuf);
  if (iVar5 == 0) {
    return 0;
  }
  if ((VA.files)->version_no == 0xffffffff) goto LAB_0011a65b;
  if (((VA.files)->version_no == 0) && (VA.files[1].version_no == 0xffffffff)) {
    get_versionless(VA.files,vless,dir);
    iVar5 = strcmp(dst,vless);
    if (iVar5 != 0) {
      strcpy(fbuf,vless);
      sVar9 = strlen(fbuf);
      (fbuf + sVar9)[0] = '.';
      (fbuf + sVar9)[1] = '~';
      fbuf[sVar9 + 2] = '\0';
      sVar9 = strlen(fbuf);
      (fbuf + sVar9)[0] = '1';
      (fbuf + sVar9)[1] = '\0';
      sVar9 = strlen(fbuf);
      (fbuf + sVar9)[0] = '~';
      (fbuf + sVar9)[1] = '\0';
      alarm(TIMEOUT_TIME);
      piVar10 = __errno_location();
      do {
        *piVar10 = 0;
        iVar5 = rename(vless,fbuf);
        if (iVar5 != -1) goto LAB_0011a654;
      } while (*piVar10 == 4);
      alarm(0);
      iVar5 = *piVar10;
      goto LAB_0011a888;
    }
    goto LAB_0011a65b;
  }
  get_versionless(VA.files,vless,dir);
  iVar5 = check_vless_link(vless,VA.files,fbuf,(int *)&local_504c);
  if (iVar5 == 0) {
    return 0;
  }
  iVar5 = strcmp(dst,fbuf);
  if (iVar5 != 0) goto LAB_0011a65b;
  alarm(TIMEOUT_TIME);
  piVar10 = __errno_location();
  do {
    *piVar10 = 0;
    iVar5 = unlink(vless);
    if (iVar5 != -1) goto LAB_0011a654;
  } while (*piVar10 == 4);
  goto LAB_0011a87c;
LAB_0011a654:
  alarm(0);
LAB_0011a65b:
  iVar5 = unpack_filename(src,dir,fbuf,ver,1);
  if (iVar5 == 0) {
    return 0;
  }
  iVar5 = get_version_array(dir,fbuf);
  varray = VA.files;
  if (iVar5 == 0) {
    return 0;
  }
  if ((VA.files)->version_no == 0xffffffff) {
    return 0;
  }
  strcpy(src,fbuf);
  if (ver[0] != '\0') {
    sVar9 = strlen(src);
    (src + sVar9)[0] = '.';
    (src + sVar9)[1] = '~';
    src[sVar9 + 2] = '\0';
    strcat(src,ver);
    sVar9 = strlen(src);
    (src + sVar9)[0] = '~';
    (src + sVar9)[1] = '\0';
  }
  iVar5 = get_old(dir,varray,src,fbuf);
  if (iVar5 == 0) {
    return 0;
  }
  iVar5 = get_versionless(VA.files,vless,dir);
  bVar2 = true;
  if (iVar5 != 0) {
    iVar5 = check_vless_link(vless,VA.files,fbuf,(int *)&local_504c);
    if (iVar5 == 0) {
      return 0;
    }
    iVar5 = strcmp(src,vless);
    if ((iVar5 == 0) && (fbuf[0] != '\0')) {
      alarm(TIMEOUT_TIME);
      piVar10 = __errno_location();
      do {
        *piVar10 = 0;
        iVar5 = unlink(fbuf);
        if (iVar5 != -1) goto LAB_0011a831;
      } while (*piVar10 == 4);
    }
    else {
      iVar5 = strcmp(src,fbuf);
      if (iVar5 != 0) goto LAB_0011a83c;
      alarm(TIMEOUT_TIME);
      piVar10 = __errno_location();
      do {
        *piVar10 = 0;
        iVar5 = unlink(vless);
        if (iVar5 != -1) goto LAB_0011a831;
      } while (*piVar10 == 4);
    }
    alarm(0);
    iVar5 = *piVar10;
    goto LAB_0011a888;
  }
  goto LAB_0011a83c;
LAB_0011a831:
  alarm(0);
  bVar2 = false;
LAB_0011a83c:
  alarm(TIMEOUT_TIME);
  piVar10 = __errno_location();
  do {
    *piVar10 = 0;
    iVar5 = rename(src,dst);
    if (iVar5 != -1) {
      alarm(0);
      iVar5 = maintain_version(dst,0);
      if (iVar5 == 0) {
        return 0;
      }
      if ((!bVar2) && (iVar5 = maintain_version(src,0), iVar5 == 0)) {
        return 0;
      }
      return 0x4c;
    }
  } while (*piVar10 == 4);
LAB_0011a87c:
  alarm(0);
  iVar5 = *piVar10;
LAB_0011a888:
  *Lisp_errno = iVar5;
  return 0;
}

Assistant:

LispPTR DSK_renamefile(LispPTR *args)
{
  char src[MAXPATHLEN], dst[MAXPATHLEN];
  char fbuf[MAXPATHLEN], vless[MAXPATHLEN], svless[MAXPATHLEN];
  char dir[MAXPATHLEN], ver[VERSIONLEN];
  int rval, fatp;
  int need_maintain_flg;
#ifdef DOS
  char drive1[1], drive2[1];
  int extlen1, extlen2; /* len of extension */
  char rawname1[MAXNAMLEN], rawname2[MAXNAMLEN];
#endif /* DOS */

  ERRSETJMP(NIL);
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[2]);

  LispStringLength(args[0], rval, fatp);
  /*
   * Because of the version number convention, Lisp pathname might
   * be shorter than UNIX one.  For THIN string, the difference
   * is 2 bytes, for FAT string, 4 bytes.  Add 1 byte for NULL
   * terminating character.
   */
  rval = fatp ? rval + 4 + 1 : rval + 2 + 1;
  if (rval > MAXPATHLEN) FileNameTooLong(NIL);

  LispStringLength(args[1], rval, fatp);
  rval = fatp ? rval + 4 + 1 : rval + 2 + 1;
  if (rval > MAXPATHLEN) FileNameTooLong(NIL);

  LispStringToCString(args[0], fbuf, MAXPATHLEN);
#ifdef DOS
  separate_drive(fbuf, drive1);
  unixpathname(fbuf, src, 1, 0, drive1, &extlen1, rawname1);
#else  /* DOS */
  unixpathname(fbuf, src, 1, 0);
#endif /* DOS */

  LispStringToCString(args[1], fbuf, MAXPATHLEN);
#ifdef DOS
  separate_drive(fbuf, drive2);
  unixpathname(fbuf, dst, 1, 0, drive2, &extlen2, rawname2);
#else  /* DOS */
  unixpathname(fbuf, dst, 1, 0);
#endif /* DOS */

  if (unpack_filename(dst, dir, fbuf, ver, 1) == 0) return (NIL);
  /*
   * The destination file has been recognized as new file.  Thus we have
   * to make sure that the directory exists.
   */
  if (make_directory(dir) == 0) return (NIL);

  /*
   * We maintain the destination to handle the link damaged case correctly.
   */
  ConcDirAndName(dir, fbuf, dst);
  if (maintain_version(dst, 0) == 0) return (NIL);

  if (get_version_array(dir, fbuf) == 0) return (NIL);

  /*
   * Although the file should have been recognized with "new" mode in Lisp
   * code, we have to recognize it again to know the "real" accessible name
   * of it.
   */

  ConcNameAndVersion(fbuf, ver, dst);
  if (get_new(dir, VA.files, dst, fbuf) == 0) return (NIL);

  /*
   * At this point, there are three cases for the destination.  If there is
   * no member of the destination family, there is nothing to do.  If there
   * is only a versionless file and, if the "real" destination is not the
   * versionless, we have to rename it to version 1.  And last case, if the
   * "real" destination file is the file to which the versionless file is linked,
   * we have to unlink the versionless file.
   */
  if (!NoFileP(VA.files)) {
    if (OnlyVersionlessP(VA.files)) {
      get_versionless(VA.files, vless, dir);
      if (strcmp(dst, vless) != 0) {
        ConcNameAndVersion(vless, "1", fbuf);
        TIMEOUT(rval = rename(vless, fbuf));
        if (rval == -1) {
          *Lisp_errno = errno;
          return (NIL);
        }
      }
    } else {
      /*
       * We are sure that the versionless file is linked to one of
       * the higher versioned file here.
       */
      get_versionless(VA.files, vless, dir);
      if (check_vless_link(vless, VA.files, fbuf, &rval) == 0) { return (NIL); }
      if (strcmp(dst, fbuf) == 0) {
        TIMEOUT(rval = unlink(vless));
        if (rval == -1) {
          *Lisp_errno = errno;
          return (NIL);
        }
      }
    }
  }

  if (unpack_filename(src, dir, fbuf, ver, 1) == 0) return (NIL);
  if (get_version_array(dir, fbuf) == 0) return (NIL);

  if (NoFileP(VA.files))
    return (NIL); /*
                   * If the specified file is deleted from
                   * outside of Lisp during the last time
                   * Lisp recognize it and now, this case
                   * will occur.
                   */

  /*
   * Although the file should have been recognized with "old" mode in Lisp
   * code, we have to recognize it again to know the "real" accessible name
   * of it.
   */
  ConcNameAndVersion(fbuf, ver, src);
  if (get_old(dir, VA.files, src, fbuf) == 0) return (NIL);

  if (get_versionless(VA.files, vless, dir) == 0) {
    /*
     * There is no versionless file.  All we have to do is to simply
     * try to rename the specified file.
     */
    need_maintain_flg = 0;
  } else {
    /*
     * If a versionless file exists, we have to check the link status
     * of it, because renaming a versionless file or a file to which a
     * versionless file is linked will destroy the consistency of the
     * version status.
     */
    if (check_vless_link(vless, VA.files, fbuf, &rval) == 0) return (NIL);

    if (strcmp(src, vless) == 0 && *fbuf != '\0') {
      /*
       * At this point, we only unlink the file to which the
       * versionless is linked.  The versionless fill will be
       * renamed later.
       */
      TIMEOUT(rval = unlink(fbuf));
      if (rval == -1) {
        *Lisp_errno = errno;
        return (NIL);
      }
      need_maintain_flg = 1;
    } else if (strcmp(src, fbuf) == 0) {
      TIMEOUT(rval = unlink(vless));
      if (rval == -1) {
        *Lisp_errno = errno;
        return (NIL);
      }
      need_maintain_flg = 1;
    } else {
      need_maintain_flg = 0;
    }
    strcpy(svless, vless);
  }

  /*
   * At this point, src holds the full file name to be renamed, and dst holds
   * the full file name to which src will be renamed.
   */

  TIMEOUT(rval = rename(src, dst));
  if (rval == -1) {
    *Lisp_errno = errno;
    return (NIL);
  }

  /*
   * The destination directory always have to be maintained, because it is
   * now under control of DSK device.
   * The source directory have to be maintained only if need_maintain_flg
   * is on.
   */

  if (maintain_version(dst, 0) == 0) return (NIL);
  if (need_maintain_flg) {
    if (maintain_version(src, 0) == 0) return (NIL);
  }

  return (ATOM_T);
}